

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::setNoReplayFor(QMenu *this,QWidget *noReplayFor)

{
  long lVar1;
  int *piVar2;
  undefined8 uVar3;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (noReplayFor == (QWidget *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = QtSharedPointer::ExternalRefCountData::getAndRef(&noReplayFor->super_QObject);
  }
  piVar2 = *(int **)(lVar1 + 0x3d8);
  *(undefined8 *)(lVar1 + 0x3d8) = uVar3;
  *(QWidget **)(lVar1 + 0x3e0) = noReplayFor;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
      return;
    }
  }
  return;
}

Assistant:

void QMenu::setNoReplayFor(QWidget *noReplayFor)
{
    d_func()->noReplayFor = noReplayFor;
}